

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O3

void ssh1_connection_reconfigure(PacketProtocolLayer *ppl,Conf *conf)

{
  Interactor *conf_00;
  
  conf_free((Conf *)ppl[-3].interactor);
  conf_00 = (Interactor *)conf_copy(conf);
  ppl[-3].interactor = conf_00;
  if (*(char *)&ppl[-1].bpp == '\x01') {
    portfwdmgr_config((PortFwdManager *)ppl[-1].vt,(Conf *)conf_00);
    return;
  }
  return;
}

Assistant:

static void ssh1_connection_reconfigure(PacketProtocolLayer *ppl, Conf *conf)
{
    struct ssh1_connection_state *s =
        container_of(ppl, struct ssh1_connection_state, ppl);

    conf_free(s->conf);
    s->conf = conf_copy(conf);

    if (s->portfwdmgr_configured)
        portfwdmgr_config(s->portfwdmgr, s->conf);
}